

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

char * ptls_hexdump(char *dst,void *_src,size_t len)

{
  byte bVar1;
  char *pcVar2;
  long lVar3;
  char *buf;
  size_t sVar4;
  
  pcVar2 = dst;
  if (len != 0) {
    lVar3 = 0;
    sVar4 = 0;
    do {
      bVar1 = *(byte *)((long)_src + sVar4);
      dst[sVar4 * 2] =
           "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 >> 4) + 0x20];
      dst[sVar4 * 2 + 1] =
           "0123456789abcdef0123456789abcdef0123456789abcdef"[(ulong)(bVar1 & 0xf) + 0x20];
      sVar4 = sVar4 + 1;
      lVar3 = lVar3 + -2;
    } while (len != sVar4);
    dst = dst + -lVar3;
  }
  *dst = '\0';
  return pcVar2;
}

Assistant:

char *ptls_hexdump(char *dst, const void *_src, size_t len)
{
    char *buf = dst;
    const uint8_t *src = _src;

    for (size_t i = 0; i != len; ++i)
        dst = byte_to_hex(dst, src[i]);
    *dst = '\0';
    return buf;
}